

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int freezeset(parse *p,cset *cs)

{
  cset *pcVar1;
  cset *pcVar2;
  size_t css;
  cset *cs2;
  cset *top;
  size_t i;
  cset *pcStack_18;
  uch h;
  cset *cs_local;
  parse *p_local;
  
  pcVar1 = p->g->sets + p->g->ncsets;
  pcVar2 = (cset *)(long)p->g->csetsize;
  for (css = (size_t)p->g->sets; css < pcVar1; css = css + 0x20) {
    if ((*(uch *)(css + 9) == cs->hash) && ((cset *)css != cs)) {
      top = (cset *)0x0;
      while ((top < pcVar2 &&
             (((*(byte *)(*(long *)css + ((ulong)top & 0xff)) & *(byte *)(css + 8)) != 0) ==
              ((cs->ptr[(ulong)top & 0xff] & cs->mask) != 0)))) {
        top = (cset *)((long)&top->ptr + 1);
      }
      if (top == pcVar2) break;
    }
  }
  pcStack_18 = cs;
  if (css < pcVar1) {
    freeset(p,cs);
    pcStack_18 = (cset *)css;
  }
  return (int)((long)pcStack_18 - (long)p->g->sets >> 5);
}

Assistant:

static int			/* set number */
freezeset(p, cs)
struct parse *p;
cset *cs;
{
	uch h = cs->hash;
	size_t i;
	cset *top = &p->g->sets[p->g->ncsets];
	cset *cs2;
	size_t css = (size_t)p->g->csetsize;

	/* look for an earlier one which is the same */
	for (cs2 = &p->g->sets[0]; cs2 < top; cs2++)
		if (cs2->hash == h && cs2 != cs) {
			/* maybe */
			for (i = 0; i < css; i++)
				if (!!CHIN(cs2, i) != !!CHIN(cs, i))
					break;		/* no */
			if (i == css)
				break;			/* yes */
		}

	if (cs2 < top) {	/* found one */
		freeset(p, cs);
		cs = cs2;
	}

	return((int)(cs - p->g->sets));
}